

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explore_eval.cc
# Opt level: O0

void EXPLORE_EVAL::do_actual_learning<true>(explore_eval *data,multi_learner *base,multi_ex *ec_seq)

{
  bool bVar1;
  example *peVar2;
  reference ppeVar3;
  size_t sVar4;
  action_score *paVar5;
  float *pfVar6;
  cb_class *pcVar7;
  reference ppeVar8;
  vector<example_*,_std::allocator<example_*>_> *in_RDX;
  undefined8 *in_RDI;
  float fVar9;
  cb_class cVar10;
  example **ec_1;
  iterator __end5;
  iterator __begin5;
  multi_ex *__range5;
  float inv_threshold;
  example **ec;
  iterator __end4;
  iterator __begin4;
  multi_ex *__range4;
  example *ec_found;
  float threshold;
  size_t i;
  float action_probability;
  action_scores *a_s;
  example *label_example;
  multi_ex *in_stack_00000660;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  uint32_t in_stack_ffffffffffffff54;
  __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_> local_90 [2];
  float local_7c;
  reference local_78;
  example **local_70;
  __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_> local_68 [2];
  example *local_58;
  float local_50;
  float local_4c;
  undefined8 in_stack_ffffffffffffffb8;
  uint32_t uVar12;
  ulong uVar11;
  ulong i_00;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  float fVar13;
  multi_ex *in_stack_ffffffffffffffc8;
  v_array<ACTION_SCORE::action_score> *this;
  multi_learner *in_stack_ffffffffffffffd0;
  undefined8 local_28;
  
  uVar12 = (uint32_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  peVar2 = CB_EXPLORE_ADF::test_adf_sequence(in_stack_00000660);
  if (peVar2 != (example *)0x0) {
    *(label_t *)(in_RDI + 4) = (peVar2->l).multi;
    in_RDI[5] = (peVar2->l).cs.costs._end;
    in_RDI[6] = (peVar2->l).cs.costs.end_array;
    in_RDI[7] = (peVar2->l).cs.costs.erase_count;
    (peVar2->l).multi = *(label_t *)(in_RDI + 8);
    (peVar2->l).cs.costs._end = (wclass *)in_RDI[9];
    (peVar2->l).cs.costs.end_array = (wclass *)in_RDI[10];
    (peVar2->l).cs.costs.erase_count = in_RDI[0xb];
  }
  LEARNER::multiline_learn_or_predict<false>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),uVar12);
  if (peVar2 != (example *)0x0) {
    (peVar2->l).multi = *(label_t *)(in_RDI + 4);
    (peVar2->l).cs.costs._end = (wclass *)in_RDI[5];
    (peVar2->l).cs.costs.end_array = (wclass *)in_RDI[6];
    (peVar2->l).cs.costs.erase_count = in_RDI[7];
  }
  cVar10 = CB_ADF::get_observed_cost
                     ((multi_ex *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  *in_RDI = cVar10._0_8_;
  local_28 = cVar10._8_8_;
  in_RDI[1] = local_28;
  if (peVar2 != (example *)0x0) {
    ppeVar3 = std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RDX,0);
    this = (v_array<ACTION_SCORE::action_score> *)&(*ppeVar3)->pred;
    fVar13 = 0.0;
    uVar11 = 0;
    while (i_00 = uVar11, sVar4 = v_array<ACTION_SCORE::action_score>::size(this), uVar11 < sVar4) {
      in_stack_ffffffffffffff54 = *(uint32_t *)((long)in_RDI + 4);
      paVar5 = v_array<ACTION_SCORE::action_score>::operator[](this,i_00);
      if (in_stack_ffffffffffffff54 == paVar5->action) {
        paVar5 = v_array<ACTION_SCORE::action_score>::operator[](this,i_00);
        fVar13 = paVar5->score;
      }
      uVar11 = i_00 + 1;
    }
    local_4c = fVar13 / *(float *)(in_RDI + 1);
    if ((*(byte *)((long)in_RDI + 0x7c) & 1) == 0) {
      local_50 = 1.0 / local_4c;
      pfVar6 = std::min<float>((float *)(in_RDI + 0xf),&local_50);
      *(float *)(in_RDI + 0xf) = *pfVar6;
    }
    else {
      local_4c = *(float *)(in_RDI + 0xf) * local_4c;
    }
    if (1.000001 < local_4c) {
      in_RDI[0xe] = in_RDI[0xe] + 1;
    }
    fVar9 = merand48((uint64_t *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    if (fVar9 < local_4c) {
      local_58 = (example *)0x0;
      local_68[0]._M_current =
           (example **)
           std::vector<example_*,_std::allocator<example_*>_>::begin
                     ((vector<example_*,_std::allocator<example_*>_> *)
                      CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      local_70 = (example **)
                 std::vector<example_*,_std::allocator<example_*>_>::end
                           ((vector<example_*,_std::allocator<example_*>_> *)
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                            *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                           (__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                            *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        uVar12 = (uint32_t)(i_00 >> 0x20);
        if (!bVar1) break;
        local_78 = __gnu_cxx::
                   __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                   ::operator*(local_68);
        sVar4 = v_array<CB::cb_class>::size((v_array<CB::cb_class> *)&((*local_78)->l).simple);
        if (sVar4 == 1) {
          pcVar7 = v_array<CB::cb_class>::operator[]
                             ((v_array<CB::cb_class> *)&((*local_78)->l).simple,0);
          if (((pcVar7->cost != 3.4028235e+38) || (NAN(pcVar7->cost))) &&
             (pcVar7 = v_array<CB::cb_class>::operator[]
                                 ((v_array<CB::cb_class> *)&((*local_78)->l).simple,0),
             0.0 < pcVar7->probability)) {
            local_58 = *local_78;
          }
        }
        if (1.0 < local_4c) {
          (*local_78)->weight = local_4c * (*local_78)->weight;
        }
        __gnu_cxx::
        __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>::
        operator++(local_68);
      }
      fVar9 = fVar13;
      pcVar7 = v_array<CB::cb_class>::operator[]((v_array<CB::cb_class> *)&(local_58->l).simple,0);
      pcVar7->probability = fVar13;
      LEARNER::multiline_learn_or_predict<true>
                (cVar10._0_8_,(multi_ex *)this,CONCAT44(fVar9,in_stack_ffffffffffffffc0),uVar12);
      if (1.0 < local_4c) {
        local_7c = 1.0 / local_4c;
        local_90[0]._M_current =
             (example **)
             std::vector<example_*,_std::allocator<example_*>_>::begin
                       ((vector<example_*,_std::allocator<example_*>_> *)
                        CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        std::vector<example_*,_std::allocator<example_*>_>::end
                  ((vector<example_*,_std::allocator<example_*>_> *)
                   CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                                   *)CONCAT44(in_stack_ffffffffffffff54,fVar13),
                                  (__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                                   *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)),
              bVar1) {
          ppeVar8 = __gnu_cxx::
                    __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                    ::operator*(local_90);
          (*ppeVar8)->weight = local_7c * (*ppeVar8)->weight;
          __gnu_cxx::
          __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>::
          operator++(local_90);
        }
      }
      fVar13 = *(float *)(in_RDI + 1);
      pcVar7 = v_array<CB::cb_class>::operator[]((v_array<CB::cb_class> *)&(local_58->l).simple,0);
      pcVar7->probability = fVar13;
      in_RDI[0xd] = in_RDI[0xd] + 1;
    }
  }
  return;
}

Assistant:

void do_actual_learning(explore_eval& data, multi_learner& base, multi_ex& ec_seq)
{
  example* label_example = CB_EXPLORE_ADF::test_adf_sequence(ec_seq);

  if (label_example != nullptr)  // extract label
  {
    data.action_label = label_example->l.cb;
    label_example->l.cb = data.empty_label;
  }
  multiline_learn_or_predict<false>(base, ec_seq, data.offset);

  if (label_example != nullptr)  // restore label
    label_example->l.cb = data.action_label;

  data.known_cost = CB_ADF::get_observed_cost(ec_seq);
  if (label_example != nullptr && is_learn)
  {
    ACTION_SCORE::action_scores& a_s = ec_seq[0]->pred.a_s;

    float action_probability = 0;
    for (size_t i = 0; i < a_s.size(); i++)
      if (data.known_cost.action == a_s[i].action)
        action_probability = a_s[i].score;

    float threshold = action_probability / data.known_cost.probability;

    if (!data.fixed_multiplier)
      data.multiplier = min(data.multiplier, 1 / threshold);
    else
      threshold *= data.multiplier;

    if (threshold > 1. + 1e-6)
      data.violations++;

    if (merand48(data.all->random_state) < threshold)
    {
      example* ec_found = nullptr;
      for (example*& ec : ec_seq)
      {
        if (ec->l.cb.costs.size() == 1 && ec->l.cb.costs[0].cost != FLT_MAX && ec->l.cb.costs[0].probability > 0)
          ec_found = ec;
        if (threshold > 1)
          ec->weight *= threshold;
      }
      ec_found->l.cb.costs[0].probability = action_probability;

      multiline_learn_or_predict<true>(base, ec_seq, data.offset);

      if (threshold > 1)
      {
        float inv_threshold = 1.f / threshold;
        for (auto& ec : ec_seq) ec->weight *= inv_threshold;
      }
      ec_found->l.cb.costs[0].probability = data.known_cost.probability;
      data.update_count++;
    }
  }
}